

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O3

int xmlStreamCompAddStep(xmlStreamCompPtr comp,xmlChar *name,xmlChar *ns,int nodeType,int flags)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  xmlStreamStepPtr pxVar4;
  uint uVar5;
  ulong uVar6;
  
  iVar3 = comp->nbStep;
  uVar1 = comp->maxStep;
  if (iVar3 < (int)uVar1) {
    pxVar4 = comp->steps;
  }
  else {
    if ((int)uVar1 < 1) {
      uVar6 = 4;
    }
    else {
      if (999999999 < uVar1) {
        return -1;
      }
      uVar5 = uVar1 + 1 >> 1;
      uVar2 = uVar5 + uVar1;
      if (1000000000 - uVar5 < uVar1) {
        uVar2 = 1000000000;
      }
      uVar6 = (ulong)uVar2;
    }
    pxVar4 = (xmlStreamStepPtr)(*xmlRealloc)(comp->steps,uVar6 << 5);
    if (pxVar4 == (xmlStreamStepPtr)0x0) {
      return -1;
    }
    comp->steps = pxVar4;
    comp->maxStep = (int)uVar6;
    iVar3 = comp->nbStep;
  }
  comp->nbStep = iVar3 + 1;
  pxVar4[iVar3].flags = flags;
  pxVar4[iVar3].name = name;
  pxVar4[iVar3].ns = ns;
  pxVar4[iVar3].nodeType = nodeType;
  return iVar3;
}

Assistant:

static int
xmlStreamCompAddStep(xmlStreamCompPtr comp, const xmlChar *name,
                     const xmlChar *ns, int nodeType, int flags) {
    xmlStreamStepPtr cur;

    if (comp->nbStep >= comp->maxStep) {
        xmlStreamStepPtr tmp;
        int newSize;

        newSize = xmlGrowCapacity(comp->maxStep, sizeof(tmp[0]),
                                  4, XML_MAX_ITEMS);
        if (newSize < 0) {
	    ERROR(NULL, NULL, NULL,
		  "xmlNewStreamComp: growCapacity failed\n");
	    return(-1);
        }
	cur = xmlRealloc(comp->steps, newSize * sizeof(tmp[0]));
	if (cur == NULL) {
	    ERROR(NULL, NULL, NULL,
		  "xmlNewStreamComp: malloc failed\n");
	    return(-1);
	}
	comp->steps = cur;
        comp->maxStep = newSize;
    }
    cur = &comp->steps[comp->nbStep++];
    cur->flags = flags;
    cur->name = name;
    cur->ns = ns;
    cur->nodeType = nodeType;
    return(comp->nbStep - 1);
}